

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::ForVariableDeclarationSyntax::ForVariableDeclarationSyntax
          (ForVariableDeclarationSyntax *this,Token varKeyword,DataTypeSyntax *type,
          DeclaratorSyntax *declarator)

{
  DeclaratorSyntax *pDVar1;
  undefined8 uVar2;
  DeclaratorSyntax *local_18;
  
  uVar2 = varKeyword._0_8_;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).kind = ForVariableDeclaration;
  (this->varKeyword).kind = (short)uVar2;
  (this->varKeyword).field_0x2 = (char)((ulong)uVar2 >> 0x10);
  (this->varKeyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar2 >> 0x18);
  (this->varKeyword).rawLen = (int)((ulong)uVar2 >> 0x20);
  (this->varKeyword).info = varKeyword.info;
  this->type = type;
  local_18 = declarator;
  not_null<slang::syntax::DeclaratorSyntax*>::not_null<slang::syntax::DeclaratorSyntax*,void>
            ((not_null<slang::syntax::DeclaratorSyntax*> *)&this->declarator,&local_18);
  if (this->type != (DataTypeSyntax *)0x0) {
    (this->type->super_ExpressionSyntax).super_SyntaxNode.parent = &this->super_SyntaxNode;
  }
  pDVar1 = not_null<slang::syntax::DeclaratorSyntax_*>::get(&this->declarator);
  (pDVar1->super_SyntaxNode).parent = &this->super_SyntaxNode;
  return;
}

Assistant:

ForVariableDeclarationSyntax(Token varKeyword, DataTypeSyntax* type, DeclaratorSyntax& declarator) :
        SyntaxNode(SyntaxKind::ForVariableDeclaration), varKeyword(varKeyword), type(type), declarator(&declarator) {
        if (this->type) this->type->parent = this;
        this->declarator->parent = this;
    }